

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdSubtract2(EpDouble *epd1,EpDouble *epd2)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  int sign;
  int diff;
  int exponent;
  double value;
  EpDouble *epd2_local;
  EpDouble *epd1_local;
  
  iVar2 = EpdIsNan(epd1);
  if ((iVar2 == 0) && (iVar2 = EpdIsNan(epd2), iVar2 == 0)) {
    iVar2 = EpdIsInf(epd1);
    if ((iVar2 == 0) && (iVar2 = EpdIsInf(epd2), iVar2 == 0)) {
      if ((SUB84(epd1->type,4) >> 0x14 & 0x7ff) != 0x3ff) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x329,"void EpdSubtract2(EpDouble *, EpDouble *)");
      }
      if ((SUB84(epd2->type,4) >> 0x14 & 0x7ff) != 0x3ff) {
        __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x32a,"void EpdSubtract2(EpDouble *, EpDouble *)");
      }
      if (epd2->exponent < epd1->exponent) {
        iVar2 = epd1->exponent - epd2->exponent;
        if (iVar2 < 0x400) {
          dVar1 = (epd1->type).value;
          dVar4 = (epd2->type).value;
          dVar3 = pow(2.0,(double)iVar2);
          _diff = dVar1 - dVar4 / dVar3;
        }
        else {
          _diff = epd1->type;
        }
        sign = epd1->exponent;
      }
      else if (epd1->exponent < epd2->exponent) {
        iVar2 = epd2->exponent - epd1->exponent;
        if (iVar2 < 0x400) {
          dVar1 = (epd1->type).value;
          dVar4 = pow(2.0,(double)iVar2);
          _diff = dVar1 / dVar4 - (epd2->type).value;
        }
        else {
          _diff = (epd2->type).value * -1.0;
        }
        sign = epd2->exponent;
      }
      else {
        _diff = (epd1->type).value - (epd2->type).value;
        sign = epd1->exponent;
      }
      (epd1->type).value = (double)_diff;
      epd1->exponent = sign;
      EpdNormalize(epd1);
    }
    else {
      iVar2 = EpdIsInf(epd1);
      if ((iVar2 == 0) || (iVar2 = EpdIsInf(epd2), iVar2 == 0)) {
        iVar2 = EpdIsInf(epd2);
        if (iVar2 != 0) {
          EpdCopy(epd2,epd1);
        }
      }
      else if (-1 < (int)(SUB84(epd1->type,4) ^ SUB84(epd2->type,4))) {
        EpdMakeNan(epd1);
      }
    }
  }
  else {
    EpdMakeNan(epd1);
  }
  return;
}

Assistant:

void
EpdSubtract2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(epd2)) {
      EpdCopy(epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value -
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) -
                epd2->type.value;
    } else
      value = epd2->type.value * (double)(-1.0);
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value - epd2->type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}